

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

void __thiscall
hrgls::datablob::DataBlobSource::DataBlobSource
          (DataBlobSource *this,API *api,StreamProperties *props,string *source)

{
  undefined8 uVar1;
  mapped_type mVar2;
  DataBlobSource_private *pDVar3;
  mapped_type *pmVar4;
  hrgls_API phVar5;
  element_type *peVar6;
  undefined8 uVar7;
  key_type local_a0;
  key_type local_98;
  key_type local_90;
  key_type local_88;
  key_type local_80;
  key_type local_78;
  __shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2> local_70;
  key_type local_60;
  key_type local_58;
  key_type local_50;
  key_type local_48;
  undefined8 local_40;
  hrgls_DataBlobSourceCreateParams params;
  string *local_28;
  string *source_local;
  StreamProperties *props_local;
  API *api_local;
  DataBlobSource *this_local;
  
  this->m_private = (DataBlobSource_private *)0x0;
  local_28 = source;
  source_local = (string *)props;
  props_local = (StreamProperties *)api;
  api_local = (API *)this;
  pDVar3 = (DataBlobSource_private *)operator_new(0x70);
  memset(pDVar3,0,0x70);
  DataBlobSource_private::DataBlobSource_private(pDVar3);
  this->m_private = pDVar3;
  mVar2 = hrgls_DataBlobSourceCreateParametersCreate(&local_40);
  pDVar3 = this->m_private;
  local_48._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar4 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&pDVar3->m_status,&local_48);
  *pmVar4 = mVar2;
  pDVar3 = this->m_private;
  local_50._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar4 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&pDVar3->m_status,&local_50);
  uVar1 = local_40;
  if (*pmVar4 == 0) {
    phVar5 = API::GetRawAPI((API *)props_local);
    mVar2 = hrgls_DataBlobSourceCreateParametersSetAPI(uVar1,phVar5);
    pDVar3 = this->m_private;
    local_58._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pDVar3->m_status,&local_58);
    *pmVar4 = mVar2;
    pDVar3 = this->m_private;
    local_60._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pDVar3->m_status,&local_60);
    uVar1 = local_40;
    if (*pmVar4 == 0) {
      StreamProperties::GetRawProperties((StreamProperties *)&local_70);
      peVar6 = std::__shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>::get
                         (&local_70);
      mVar2 = hrgls_DataBlobSourceCreateParametersSetStreamProperties(uVar1,peVar6);
      pDVar3 = this->m_private;
      local_78._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar4 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pDVar3->m_status,&local_78);
      *pmVar4 = mVar2;
      std::shared_ptr<hrgls_StreamProperties_>::~shared_ptr
                ((shared_ptr<hrgls_StreamProperties_> *)&local_70);
      pDVar3 = this->m_private;
      local_80._M_thread = (native_handle_type)std::this_thread::get_id();
      pmVar4 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pDVar3->m_status,&local_80);
      uVar1 = local_40;
      if (*pmVar4 == 0) {
        uVar7 = std::__cxx11::string::c_str();
        mVar2 = hrgls_DataBlobSourceCreateParametersSetName(uVar1,uVar7);
        pDVar3 = this->m_private;
        local_88._M_thread = (native_handle_type)std::this_thread::get_id();
        pmVar4 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&pDVar3->m_status,&local_88);
        *pmVar4 = mVar2;
        pDVar3 = this->m_private;
        local_90._M_thread = (native_handle_type)std::this_thread::get_id();
        pmVar4 = std::
                 map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                 ::operator[](&pDVar3->m_status,&local_90);
        if (*pmVar4 == 0) {
          mVar2 = hrgls_DataBlobSourceCreate(this->m_private,local_40);
          pDVar3 = this->m_private;
          local_98._M_thread = (native_handle_type)std::this_thread::get_id();
          pmVar4 = std::
                   map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                   ::operator[](&pDVar3->m_status,&local_98);
          *pmVar4 = mVar2;
          pDVar3 = this->m_private;
          local_a0._M_thread = (native_handle_type)std::this_thread::get_id();
          pmVar4 = std::
                   map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                   ::operator[](&pDVar3->m_status,&local_a0);
          if (*pmVar4 == 0) {
            hrgls_DataBlobSourceCreateParametersDestroy(local_40);
          }
          else {
            hrgls_DataBlobSourceCreateParametersDestroy(local_40);
          }
        }
        else {
          hrgls_DataBlobSourceCreateParametersDestroy(local_40);
        }
      }
      else {
        hrgls_DataBlobSourceCreateParametersDestroy(local_40);
      }
    }
    else {
      hrgls_DataBlobSourceCreateParametersDestroy(local_40);
    }
  }
  return;
}

Assistant:

DataBlobSource::DataBlobSource(
      API &api,
      StreamProperties &props,
      ::std::string source)
    {
      // Create the private api pointer we're going to use.  Check for
      // exception when creating it, to avoid passing it up to the caller.
      try {
        m_private = new DataBlobSource_private();
      } catch (...) {
        m_private = nullptr;
        return;
      }

      // Create and fill in the parameters to the stream creation routine
      hrgls_DataBlobSourceCreateParams params;
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreateParametersCreate(&params);
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        return;
      }
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreateParametersSetAPI(params, api.GetRawAPI());
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_DataBlobSourceCreateParametersDestroy(params);
        return;
      }
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreateParametersSetStreamProperties(params,
        props.GetRawProperties().get());
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_DataBlobSourceCreateParametersDestroy(params);
        return;
      }
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreateParametersSetName(params, source.c_str());
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_DataBlobSourceCreateParametersDestroy(params);
        return;
      }

      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceCreate(&m_private->m_stream, params);
      if (m_private->m_status[std::this_thread::get_id()] != hrgls_STATUS_OKAY) {
        hrgls_DataBlobSourceCreateParametersDestroy(params);
        return;
      }

      // Delete the structures we created along the way
      hrgls_DataBlobSourceCreateParametersDestroy(params);
    }